

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

void sysbvm_functionDefinition_ensureAnalysis
               (sysbvm_context_t *context,sysbvm_functionDefinition_t **functionDefinition)

{
  _Bool _Var1;
  sysbvm_functionSourceDefinition_t *sourceDefinition;
  sysbvm_functionDefinition_t **functionDefinition_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_tuple_isKindOf
                    (context,(sysbvm_tuple_t)*functionDefinition,
                     (context->roots).functionDefinitionType);
  if ((((_Var1) &&
       (((*functionDefinition)->bytecode == 0 ||
        (*(long *)((*functionDefinition)->bytecode + 0x48) == 0)))) &&
      (((*functionDefinition)->sourceAnalyzedDefinition == 0 ||
       (*(long *)((*functionDefinition)->sourceAnalyzedDefinition + 0x20) == 0)))) &&
     ((*(long *)((*functionDefinition)->sourceDefinition + 0x20) != 0 &&
      (*(long *)((*functionDefinition)->sourceDefinition + 0x30) != 0)))) {
    sysbvm_functionDefinition_analyze(context,functionDefinition);
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_functionDefinition_ensureAnalysis(sysbvm_context_t *context, sysbvm_functionDefinition_t **functionDefinition)
{
    // Make sure this is a valid function definition for analysis.
    if(!sysbvm_tuple_isKindOf(context, (sysbvm_tuple_t)*functionDefinition, context->roots.functionDefinitionType))
        return;

    // Is it already analyzed?
    if( ((*functionDefinition)->bytecode && ((sysbvm_functionBytecode_t*)(*functionDefinition)->bytecode)->captures) ||
        ((*functionDefinition)->sourceAnalyzedDefinition && ((sysbvm_functionSourceAnalyzedDefinition_t*)(*functionDefinition)->sourceAnalyzedDefinition)->captures) )
        return;

    sysbvm_functionSourceDefinition_t *sourceDefinition = (sysbvm_functionSourceDefinition_t *)(*functionDefinition)->sourceDefinition;
    if(!sourceDefinition->argumentNodes || !sourceDefinition->bodyNode)
        return;

    sysbvm_functionDefinition_analyze(context, functionDefinition);
}